

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

ComplexTypeInfo * __thiscall
xercesc_4_0::TraverseSchema::getTypeInfoFromNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *uriStr,XMLCh *localPart)

{
  XMLBuffer *this_00;
  XMLSize_t XVar1;
  _func_int **pp_Var2;
  XMLCh *key1;
  bool bVar3;
  int iVar4;
  Grammar *pGVar5;
  ulong uVar6;
  ComplexTypeInfo *pCVar7;
  XMLCh *pXVar8;
  XMLCh XVar9;
  undefined8 *puVar10;
  
  pGVar5 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
  if ((pGVar5 == (Grammar *)0x0) ||
     (iVar4 = (*(pGVar5->super_XSerializable)._vptr_XSerializable[5])(pGVar5), iVar4 != 1)) {
    pCVar7 = (ComplexTypeInfo *)0x0;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLValidity",0x26,uriStr,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
  }
  else {
    this_00 = &this->fBuffer;
    (this->fBuffer).fIndex = 0;
    if ((uriStr != (XMLCh *)0x0) && (*uriStr != L'\0')) {
      XMLBuffer::append(this_00,uriStr);
    }
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar1 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar1 + 1;
    (this->fBuffer).fBuffer[XVar1] = L',';
    XMLBuffer::append(this_00,localPart);
    pp_Var2 = pGVar5[7].super_XSerializable._vptr_XSerializable;
    key1 = (this->fBuffer).fBuffer;
    key1[(this->fBuffer).fIndex] = L'\0';
    if ((key1 == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*key1, uVar6 == 0)) {
      uVar6 = 0;
    }
    else {
      XVar9 = key1[1];
      if (XVar9 != L'\0') {
        pXVar8 = key1 + 2;
        do {
          uVar6 = (ulong)(ushort)XVar9 + (uVar6 >> 0x18) + uVar6 * 0x26;
          XVar9 = *pXVar8;
          pXVar8 = pXVar8 + 1;
        } while (XVar9 != L'\0');
      }
      uVar6 = uVar6 % (ulong)pp_Var2[3];
    }
    puVar10 = *(undefined8 **)(pp_Var2[2] + uVar6 * 8);
    if (puVar10 != (undefined8 *)0x0) {
      do {
        bVar3 = StringHasher::equals((StringHasher *)(pp_Var2 + 6),key1,(void *)puVar10[2]);
        if (bVar3) goto LAB_0033cd2e;
        puVar10 = (undefined8 *)puVar10[1];
      } while (puVar10 != (undefined8 *)0x0);
    }
    puVar10 = (undefined8 *)0x0;
LAB_0033cd2e:
    if (puVar10 == (undefined8 *)0x0) {
      pCVar7 = (ComplexTypeInfo *)0x0;
    }
    else {
      pCVar7 = (ComplexTypeInfo *)*puVar10;
    }
  }
  return pCVar7;
}

Assistant:

ComplexTypeInfo* TraverseSchema::getTypeInfoFromNS(const DOMElement* const elem,
                                                   const XMLCh* const uriStr,
                                                   const XMLCh* const localPart)
{

    Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

    if (grammar != 0 && grammar->getGrammarType() == Grammar::SchemaGrammarType) {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        ComplexTypeInfo* typeInfo =
            ((SchemaGrammar*)grammar)->getComplexTypeRegistry()->get(fBuffer.getRawBuffer());

        return typeInfo;
    }
    else {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
    }

    return 0;
}